

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

void Kernel::InferenceStore::Smt2ProofCheckPrinter::outputAppl(ostream *out,Term *t)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  TermList TVar5;
  UserErrorException *this;
  uint i;
  
  switch(t->_functor) {
  case 0xfffffff9:
    this = (UserErrorException *)__cxa_allocate_exception(0x50);
    Lib::UserErrorException::Exception(this,"&match are not supperted in smt2 proofcheck");
    break;
  case 0xfffffffa:
    this = (UserErrorException *)__cxa_allocate_exception(0x50);
    Lib::UserErrorException::Exception(this,"lambdas are not supperted in smt2 proofcheck");
    break;
  case 0xfffffffb:
    this = (UserErrorException *)__cxa_allocate_exception(0x50);
    Lib::UserErrorException::Exception(this,"tuples lets are not supperted in smt2 proofcheck");
    break;
  case 0xfffffffc:
    this = (UserErrorException *)__cxa_allocate_exception(0x50);
    Lib::UserErrorException::Exception(this,"tuples are not supperted in smt2 proofcheck");
    break;
  case 0xfffffffd:
    outputFormula(out,*(Formula **)&t[-1]._functor);
    return;
  case 0xfffffffe:
    std::operator<<(out,"(let ((");
    lVar1._0_4_ = t[-1]._weight;
    lVar1._4_4_ = t[-1]._kboWeight;
    if (lVar1 != 0) {
      this = (UserErrorException *)__cxa_allocate_exception(0x50);
      Lib::UserErrorException::Exception
                (this,"bindings with variables are not supperted in smt2 proofcheck");
      break;
    }
    TVar5._content = *(uint64_t *)&t[-1]._maxRedLen;
    if ((TVar5._content & 3) == 0) {
      bVar2 = Term::isBoolean((Term *)TVar5._content);
      std::operator<<(out,"?");
      if (!bVar2) goto LAB_0042ead6;
      outputPredicateName(out,t[-1]._functor);
    }
    else {
      std::operator<<(out,"?");
LAB_0042ead6:
      outputFunctionName(out,t[-1]._functor);
    }
    std::operator<<(out," ");
    outputTerm(out,TVar5);
    std::operator<<(out,"))");
    uVar3 = 0;
    goto LAB_0042eb10;
  case 0xffffffff:
    std::operator<<(out,"(ite ");
    outputFormula(out,*(Formula **)&t[-1]._functor);
    TVar5 = Term::termArg(t,0);
    outputTerm(out,TVar5);
    uVar3 = 1;
LAB_0042eb10:
    TVar5 = Term::termArg(t,uVar3);
    outputTerm(out,TVar5);
LAB_0042eb20:
    std::operator<<(out,")");
    return;
  default:
    uVar3 = Term::numTermArguments(t);
    if (uVar3 != 0) {
      std::operator<<(out,"(");
    }
    if ((t->_args[0]._content & 0x10) == 0) {
      outputFunctionName(out,t->_functor);
    }
    else {
      outputPredicateName(out,t->_functor);
    }
    for (uVar3 = 0; uVar4 = Term::numTermArguments(t), uVar3 < uVar4; uVar3 = uVar3 + 1) {
      std::operator<<(out," ");
      TVar5 = Term::termArg(t,uVar3);
      outputTerm(out,TVar5);
    }
    uVar3 = Term::numTermArguments(t);
    if (uVar3 == 0) {
      return;
    }
    goto LAB_0042eb20;
  }
  __cxa_throw(this,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException);
}

Assistant:

static void outputAppl(std::ostream& out, Term* t)
  {

    if (t->isSpecial()) {
      auto f = t->specialFunctor();
      const Term::SpecialTermData* sd = t->getSpecialData();
      switch(f) {
        case SpecialFunctor::FORMULA: outputFormula(out, sd->getFormula()); return;
        case SpecialFunctor::LET: {
          out << "(let ((";
          VList* variables = sd->getVariables();
          if (VList::isNonEmpty(variables)) 
            throw UserErrorException("bindings with variables are not supperted in smt2 proofcheck");

          auto binding = sd->getBinding();
          bool isPredicate = binding.isTerm() && binding.term()->isBoolean();

          out << "?";
          if (isPredicate) {
            outputPredicateName(out, sd->getFunctor());
          } else {
            outputFunctionName(out, sd->getFunctor());
          }
          out << " ";
          outputTerm(out, binding);
          out << "))";
          ASS_EQ(t->numTermArguments(), 1)
          outputTerm(out, t->termArg(0));
          out << ")";
          return;
        }

        case SpecialFunctor::ITE: {
          out << "(ite ";
          outputFormula(out, sd->getCondition());
          ASS_EQ(t->numTermArguments(), 2)
          outputTerm(out, t->termArg(0));
          outputTerm(out, t->termArg(1));
          out << ")";
          return;
        }
        case SpecialFunctor::TUPLE: 
            throw UserErrorException("tuples are not supperted in smt2 proofcheck");

        case SpecialFunctor::LAMBDA:
            throw UserErrorException("lambdas are not supperted in smt2 proofcheck");

        case SpecialFunctor::LET_TUPLE: 
            throw UserErrorException("tuples lets are not supperted in smt2 proofcheck");

        case SpecialFunctor::MATCH:
            throw UserErrorException("&match are not supperted in smt2 proofcheck");
      }


    } else {
      // if (isInterpretedByTranslation(t)) {
      //   outputTranslation(out, t);
      //
      // } else {

        if (t->numTermArguments() != 0) {
          out << "(";
        }
        if (t->isLiteral()) {
          outputPredicateName(out, t->functor());
        } else {
          outputFunctionName(out, t->functor());
        }

        for (unsigned i = 0; i < t->numTermArguments(); i++) {
          out << " ";
          outputTerm(out, t->termArg(i));
        }
        if (t->numTermArguments() != 0) {
          out << ")";
        }
      // }
    }
  }